

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::FillColumnPalCommand::Execute(FillColumnPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int core_skip;
  uint8_t *puVar4;
  int iVar5;
  int pass_skip;
  uint uVar6;
  int iVar7;
  
  iVar5 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
  iVar1 = *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  iVar7 = thread->pass_end_y - iVar5;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (iVar1 < iVar7) {
    iVar7 = iVar1;
  }
  uVar6 = thread->pass_start_y - iVar5;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  iVar1 = thread->num_cores;
  iVar5 = (iVar1 - (int)((iVar5 + uVar6) - thread->core) % iVar1) % iVar1;
  uVar2 = (long)(int)((~uVar6 + iVar1 + iVar7) - iVar5) / (long)iVar1;
  uVar3 = uVar2 & 0xffffffff;
  if (0 < (int)uVar2) {
    iVar7 = (this->super_PalColumnCommand)._pitch;
    puVar4 = (this->super_PalColumnCommand)._dest + (int)((iVar5 + uVar6) * iVar7);
    iVar5 = (this->super_PalColumnCommand)._color;
    do {
      *puVar4 = (uint8_t)iVar5;
      puVar4 = puVar4 + iVar1 * iVar7;
      uVar6 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar6;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void FillColumnPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;

		count = _count;
		dest = _dest;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		pitch *= thread->num_cores;

		uint8_t color = _color;
		do
		{
			*dest = color;
			dest += pitch;
		} while (--count);
	}